

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  float in_EDX;
  float in_ESI;
  undefined8 in_RDI;
  ImVec2 *min;
  float fVar5;
  undefined8 in_XMM0_Qa;
  ImVec2 IVar6;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  float default_size;
  ImRect bb;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff50;
  ImGuiCol in_stack_ffffffffffffff54;
  ImRect *in_stack_ffffffffffffff58;
  ImGuiWindow *in_stack_ffffffffffffff60;
  ImRect *in_stack_ffffffffffffff68;
  ImGuiButtonFlags flags_00;
  ImVec2 in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  ImGuiID id_00;
  ImRect *in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffffa0;
  ImVec2 local_4c;
  ImRect local_44;
  ImGuiContext *pIVar7;
  undefined4 in_stack_fffffffffffffff0;
  float fStack_8;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  fVar5 = (float)in_XMM0_Qa;
  fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
  IVar4 = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)IVar4 + 0x93) & 1U) == 0) {
    pIVar7 = GImGui;
    fVar2 = (float)ImGuiWindow::GetID(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
                                      (char *)CONCAT44(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50));
    min = (ImVec2 *)((long)IVar4 + 0xd8);
    local_4c = operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x191df4);
    ImRect::ImRect(&local_44,min,&local_4c);
    flags_00 = (ImGuiButtonFlags)((ulong)min >> 0x20);
    GetFrameHeight();
    ItemSize((ImVec2 *)in_stack_ffffffffffffff60,(float)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    bVar1 = ItemAdd(in_stack_ffffffffffffff68,(ImGuiID)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                    in_stack_ffffffffffffff58);
    if (bVar1) {
      if ((*(ImGuiItemFlags *)((long)IVar4 + 0x1cc) & 2U) != 0) {
        in_EDX = (float)((uint)in_EDX | 0x400);
      }
      local_1 = ButtonBehavior(in_stack_ffffffffffffff98,id_00,in_stack_ffffffffffffff88,
                               (bool *)in_stack_ffffffffffffff80,flags_00);
      GetColorU32(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      fVar3 = (float)GetColorU32(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      RenderNavHighlight((ImRect *)CONCAT44(fVar5,in_stack_fffffffffffffff0),
                         (ImGuiID)((ulong)in_RDI >> 0x20),(ImGuiNavHighlightFlags)in_RDI);
      IVar6.y = in_ESI;
      IVar6.x = in_EDX;
      RenderFrame(IVar6,IVar4,(ImU32)((ulong)pIVar7 >> 0x20),SUB81((ulong)pIVar7 >> 0x18,0),fVar2);
      fVar2 = 0.0;
      fVar5 = ImMax<float>(0.0,(fVar5 - pIVar7->FontSize) * 0.5);
      fVar2 = ImMax<float>(fVar2,(fStack_8 - pIVar7->FontSize) * 0.5);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,fVar5,fVar2);
      IVar6 = operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x19205a);
      IVar4.y = fVar3;
      IVar4.x = in_stack_ffffffffffffffa0;
      RenderArrow((ImDrawList *)local_44.Min,IVar4,(ImU32)local_44.Max.y,(ImGuiDir)local_44.Max.x,
                  IVar6.y);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    return pressed;
}